

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O2

int Scl_LibertyScanTable
              (Scl_Tree_t *p,Vec_Ptr_t *vOut,Scl_Item_t *pTiming,char *pName,Vec_Ptr_t *vTemples)

{
  Scl_Pair_t SVar1;
  int iVar2;
  int iVar3;
  Scl_Item_t *pSVar4;
  char *pcVar5;
  char *__s2;
  Vec_Flt_t *pVVar6;
  Vec_Flt_t *pVVar7;
  Vec_Flt_t *pVec;
  Vec_Flt_t *pVec_00;
  void *pvVar8;
  Vec_Flt_t *p_00;
  Vec_Int_t *pVVar9;
  uint i;
  Vec_Ptr_t *pVVar10;
  int *piVar11;
  float Entry;
  Vec_Flt_t *local_68;
  Vec_Flt_t *local_60;
  Vec_Flt_t *local_48;
  Vec_Flt_t *local_40;
  Vec_Flt_t *local_38;
  
  piVar11 = &pTiming->Child;
  while( true ) {
    pSVar4 = Scl_LibertyItem(p,*piVar11);
    if (pSVar4 == (Scl_Item_t *)0x0) {
      return 0;
    }
    iVar2 = Scl_LibertyCompare(p,pSVar4->Key,pName);
    if (iVar2 == 0) break;
    piVar11 = &pSVar4->Next;
  }
  pcVar5 = Scl_LibertyReadString(p,pSVar4->Head);
  if (*pcVar5 == '\0') {
    piVar11 = &pSVar4->Child;
    pVVar6 = (Vec_Flt_t *)0x0;
    pVVar7 = (Vec_Flt_t *)0x0;
    local_60 = (Vec_Flt_t *)0x0;
    while (pSVar4 = Scl_LibertyItem(p,*piVar11), pSVar4 != (Scl_Item_t *)0x0) {
      SVar1 = pSVar4->Key;
      iVar2 = Scl_LibertyCompare(p,SVar1,"index_1");
      if (iVar2 == 0) {
        if (pVVar6 != (Vec_Flt_t *)0x0) {
          __assert_fail("vIndex1 == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                        ,0x40f,
                        "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                       );
        }
        pcVar5 = Scl_LibertyReadString(p,pSVar4->Head);
        pVVar6 = Scl_LibertyReadFloatVec(pcVar5);
      }
      else {
        iVar2 = Scl_LibertyCompare(p,SVar1,"index_2");
        if (iVar2 == 0) {
          if (pVVar7 != (Vec_Flt_t *)0x0) {
            __assert_fail("vIndex2 == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                          ,0x411,
                          "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
          pcVar5 = Scl_LibertyReadString(p,pSVar4->Head);
          pVVar7 = Scl_LibertyReadFloatVec(pcVar5);
        }
        else {
          iVar2 = Scl_LibertyCompare(p,SVar1,"values");
          if (iVar2 == 0) {
            if (local_60 != (Vec_Flt_t *)0x0) {
              __assert_fail("vValues == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                            ,0x413,
                            "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                           );
            }
            pcVar5 = Scl_LibertyReadString(p,pSVar4->Head);
            local_60 = Scl_LibertyReadFloatVec(pcVar5);
          }
        }
      }
      piVar11 = &pSVar4->Next;
    }
    if (((pVVar6 != (Vec_Flt_t *)0x0) && (pVVar7 != (Vec_Flt_t *)0x0)) &&
       (local_60 != (Vec_Flt_t *)0x0)) {
      Vec_PtrPush(vOut,pVVar6);
      Vec_PtrPush(vOut,pVVar7);
      Vec_PtrPush(vOut,local_60);
      return 1;
    }
    pcVar5 = "Incomplete table specification";
  }
  else {
    iVar2 = strcmp(pcVar5,"scalar");
    if (iVar2 != 0) {
      iVar2 = 1;
      while( true ) {
        i = iVar2 - 1;
        if (vTemples->nSize <= (int)i) {
          puts("Template cannot be found in the template library");
          return 0;
        }
        __s2 = (char *)Vec_PtrEntry(vTemples,i);
        if (((i & 3) == 0) && (iVar3 = strcmp(pcVar5,__s2), iVar3 == 0)) break;
        iVar2 = iVar2 + 1;
      }
      piVar11 = &pSVar4->Child;
      local_68 = (Vec_Flt_t *)0x0;
      pVVar7 = (Vec_Flt_t *)0x0;
      pVVar6 = (Vec_Flt_t *)0x0;
      while (pSVar4 = Scl_LibertyItem(p,*piVar11), pSVar4 != (Scl_Item_t *)0x0) {
        SVar1 = pSVar4->Key;
        iVar3 = Scl_LibertyCompare(p,SVar1,"index_1");
        if (iVar3 == 0) {
          if (local_68 != (Vec_Flt_t *)0x0) {
            __assert_fail("vIndex1 == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                          ,0x440,
                          "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
          pcVar5 = Scl_LibertyReadString(p,pSVar4->Head);
          local_68 = Scl_LibertyReadFloatVec(pcVar5);
        }
        else {
          iVar3 = Scl_LibertyCompare(p,SVar1,"index_2");
          if (iVar3 == 0) {
            if (pVVar7 != (Vec_Flt_t *)0x0) {
              __assert_fail("vIndex2 == NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                            ,0x442,
                            "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                           );
            }
            pcVar5 = Scl_LibertyReadString(p,pSVar4->Head);
            pVVar7 = Scl_LibertyReadFloatVec(pcVar5);
          }
          else {
            iVar3 = Scl_LibertyCompare(p,SVar1,"values");
            if (iVar3 == 0) {
              if (pVVar6 != (Vec_Flt_t *)0x0) {
                __assert_fail("vValues == NULL",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                              ,0x444,
                              "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                             );
              }
              pcVar5 = Scl_LibertyReadString(p,pSVar4->Head);
              pVVar6 = Scl_LibertyReadFloatVec(pcVar5);
            }
          }
        }
        piVar11 = &pSVar4->Next;
      }
      local_38 = local_68;
      local_48 = pVVar6;
      local_40 = pVVar7;
      pVec = (Vec_Flt_t *)Vec_PtrEntry(vTemples,iVar2 + 1);
      pVec_00 = (Vec_Flt_t *)Vec_PtrEntry(vTemples,iVar2 + 2);
      pvVar8 = Vec_PtrEntry(vTemples,iVar2);
      if (pvVar8 == (void *)0x0) {
        if ((local_68 != (Vec_Flt_t *)0x0) && (local_68->nSize != pVec->nSize)) {
          __assert_fail("!vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                        ,1099,
                        "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                       );
        }
        if ((pVVar7 != (Vec_Flt_t *)0x0) &&
           (piVar11 = &pVec_00->nSize, pVec_00 = pVVar7, pVVar7->nSize != *piVar11)) {
          __assert_fail("!vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd2)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                        ,0x44c,
                        "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                       );
        }
        if (local_68 != (Vec_Flt_t *)0x0) {
          pVec = local_68;
        }
        pVVar7 = Vec_FltDup(pVec);
        Vec_PtrPush(vOut,pVVar7);
        pVVar7 = Vec_FltDup(pVec_00);
        Vec_PtrPush(vOut,pVVar7);
        p_00 = Vec_FltDup(pVVar6);
      }
      else {
        p_00 = Vec_FltAlloc(pVVar6->nSize);
        if ((pVVar7 != (Vec_Flt_t *)0x0) && (pVVar7->nSize != pVec->nSize)) {
          __assert_fail("!vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                        ,0x457,
                        "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                       );
        }
        if (local_68 == (Vec_Flt_t *)0x0) {
          iVar2 = pVec_00->nSize;
          local_68 = pVec_00;
        }
        else {
          iVar2 = local_68->nSize;
          if (iVar2 != pVec_00->nSize) {
            __assert_fail("!vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd2)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                          ,0x458,
                          "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                         );
          }
        }
        if (pVVar7 != (Vec_Flt_t *)0x0) {
          pVec = pVVar7;
        }
        iVar2 = iVar2 * pVec->nSize;
        if (iVar2 != pVVar6->nSize) {
          __assert_fail("Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                        ,0x45c,
                        "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                       );
        }
        for (iVar3 = 0; iVar3 < iVar2; iVar3 = iVar3 + 1) {
          Vec_FltEntry(pVVar6,iVar3);
          Entry = Vec_FltEntry(pVVar6,(iVar3 % local_68->nSize) * pVec->nSize +
                                      iVar3 / local_68->nSize);
          Vec_FltPush(p_00,Entry);
          iVar2 = pVVar6->nSize;
        }
        if (iVar2 != p_00->nSize) {
          __assert_fail("Vec_FltSize(vValues) == Vec_FltSize(vValues2)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                        ,0x464,
                        "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                       );
        }
        pVVar6 = Vec_FltDup(pVec);
        Vec_PtrPush(vOut,pVVar6);
        pVVar6 = Vec_FltDup(local_68);
        Vec_PtrPush(vOut,pVVar6);
      }
      Vec_PtrPush(vOut,p_00);
      Vec_FltFreeP(&local_38);
      Vec_FltFreeP(&local_40);
      Vec_FltFreeP(&local_48);
      return 1;
    }
    pSVar4 = Scl_LibertyItem(p,pSVar4->Child);
    if (pSVar4 == (Scl_Item_t *)0x0) {
      return 1;
    }
    iVar2 = Scl_LibertyCompare(p,pSVar4->Key,"values");
    if (iVar2 == 0) {
      pcVar5 = Scl_LibertyReadString(p,pSVar4->Head);
      pVVar6 = Scl_LibertyReadFloatVec(pcVar5);
      if (pVVar6->nSize != 1) {
        __assert_fail("Vec_FltSize(vValues) == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/scl/sclLiberty.c"
                      ,0x426,
                      "int Scl_LibertyScanTable(Scl_Tree_t *, Vec_Ptr_t *, Scl_Item_t *, char *, Vec_Ptr_t *)"
                     );
      }
      pVVar9 = Vec_IntStart((int)pcVar5);
      pVVar10 = vOut;
      Vec_PtrPush(vOut,pVVar9);
      pVVar9 = Vec_IntStart((int)pVVar10);
      Vec_PtrPush(vOut,pVVar9);
      Vec_PtrPush(vOut,pVVar6);
      return 1;
    }
    pcVar5 = "Cannot read \"scalar\" template";
  }
  puts(pcVar5);
  return 0;
}

Assistant:

int Scl_LibertyScanTable( Scl_Tree_t * p, Vec_Ptr_t * vOut, Scl_Item_t * pTiming, char * pName, Vec_Ptr_t * vTemples )
{
    Vec_Flt_t * vIndex1 = NULL;
    Vec_Flt_t * vIndex2 = NULL;
    Vec_Flt_t * vValues = NULL;
    Vec_Flt_t * vInd1, * vInd2;
    Scl_Item_t * pItem, * pTable = NULL;
    char * pThis, * pTempl = NULL;
    int iPlace, i;
    float Entry;
    // find the table
    Scl_ItemForEachChildName( p, pTiming, pTable, pName )
        break;
    if ( pTable == NULL )
        return 0;
    // find the template
    pTempl = Scl_LibertyReadString(p, pTable->Head);
    if ( pTempl == NULL || pTempl[0] == 0 )
    {
        // read the numbers
        Scl_ItemForEachChild( p, pTable, pItem )
        {
            if ( !Scl_LibertyCompare(p, pItem->Key, "index_1") )
                assert(vIndex1 == NULL), vIndex1 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "index_2") )
                assert(vIndex2 == NULL), vIndex2 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
                assert(vValues == NULL), vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
        }
        if ( vIndex1 == NULL || vIndex2 == NULL || vValues == NULL )
            { printf( "Incomplete table specification\n" ); return 0; }
        // dump the table
        vInd1 = vIndex1;
        vInd2 = vIndex2;
        // write entries
        Vec_PtrPush( vOut, vInd1 );
        Vec_PtrPush( vOut, vInd2 );
        Vec_PtrPush( vOut, vValues );
    }
    else if ( !strcmp(pTempl, "scalar") )
    {
        Scl_ItemForEachChild( p, pTable, pItem )
            if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
            {
                assert(vValues == NULL);
                vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
                assert( Vec_FltSize(vValues) == 1 );
                // write entries
                Vec_PtrPush( vOut, Vec_IntStart(1) );
                Vec_PtrPush( vOut, Vec_IntStart(1) );
                Vec_PtrPush( vOut, vValues );
                break;
            }
            else
            { printf( "Cannot read \"scalar\" template\n" ); return 0; }
    }
    else
    {
        // fetch the template
        iPlace = -1;
        Vec_PtrForEachEntry( char *, vTemples, pThis, i )
            if ( i % 4 == 0 && !strcmp(pTempl, pThis) )
            {  
                iPlace = i;
                break;
            }
        if ( iPlace == -1 )
            { printf( "Template cannot be found in the template library\n" ); return 0; }
        // read the numbers
        Scl_ItemForEachChild( p, pTable, pItem )
        {
            if ( !Scl_LibertyCompare(p, pItem->Key, "index_1") )
                assert(vIndex1 == NULL), vIndex1 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "index_2") )
                assert(vIndex2 == NULL), vIndex2 = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
            else if ( !Scl_LibertyCompare(p, pItem->Key, "values") )
                assert(vValues == NULL), vValues = Scl_LibertyReadFloatVec( Scl_LibertyReadString(p, pItem->Head) );
        }
        // check the template style
        vInd1 = (Vec_Flt_t *)Vec_PtrEntry( vTemples, iPlace + 2 ); // slew
        vInd2 = (Vec_Flt_t *)Vec_PtrEntry( vTemples, iPlace + 3 ); // load
        if ( Vec_PtrEntry(vTemples, iPlace + 1) == NULL ) // normal order (vIndex1 is slew; vIndex2 is load)
        {
            assert( !vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd1) );
            assert( !vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd2) );
            vInd1 = vIndex1 ? vIndex1 : vInd1;
            vInd2 = vIndex2 ? vIndex2 : vInd2;
            // write entries
            Vec_PtrPush( vOut, Vec_FltDup(vInd1) );
            Vec_PtrPush( vOut, Vec_FltDup(vInd2) );
            Vec_PtrPush( vOut, Vec_FltDup(vValues) );
        }
        else  // reverse order (vIndex2 is slew; vIndex1 is load)
        {
            Vec_Flt_t * vValues2 = Vec_FltAlloc( Vec_FltSize(vValues) );
            assert( !vIndex2 || Vec_FltSize(vIndex2) == Vec_FltSize(vInd1) );
            assert( !vIndex1 || Vec_FltSize(vIndex1) == Vec_FltSize(vInd2) );
            vInd1 = vIndex2 ? vIndex2 : vInd1;
            vInd2 = vIndex1 ? vIndex1 : vInd2;
            // write entries -- transpose
            assert( Vec_FltSize(vInd1) * Vec_FltSize(vInd2) == Vec_FltSize(vValues) );
            Vec_FltForEachEntry( vValues, Entry, i )
            {
                int x = i % Vec_FltSize(vInd2);
                int y = i / Vec_FltSize(vInd2);
                Entry = Vec_FltEntry( vValues, x * Vec_FltSize(vInd1) + y );
                Vec_FltPush( vValues2, Entry );
            }
            assert( Vec_FltSize(vValues) == Vec_FltSize(vValues2) );
            // write entries
            Vec_PtrPush( vOut, Vec_FltDup(vInd1) );
            Vec_PtrPush( vOut, Vec_FltDup(vInd2) );
            Vec_PtrPush( vOut, vValues2 );
        }
        Vec_FltFreeP( &vIndex1 );
        Vec_FltFreeP( &vIndex2 );
        Vec_FltFreeP( &vValues );
    }
    return 1;
}